

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP3Deserializer::ParseVariablesIndex
          (BP3Deserializer *this,BufferSTL *bufferSTL,Engine *engine)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  vector<char,_std::allocator<char>_> *pvVar4;
  ulong __n;
  future<void> *__fut;
  reference pvVar5;
  reference_wrapper<adios2::core::Engine> __args;
  reference_wrapper<const_std::vector<char,_std::allocator<char>_>_> __args_1;
  __basic_future<void> *this_00;
  long in_RSI;
  future<void> **__stat_loc;
  long *in_RDI;
  string *in_stack_00000010;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  future<void> *async;
  iterator __end2;
  iterator __begin2;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *__range2;
  size_t elementIndexSize_1;
  uint t;
  bool launched;
  vector<unsigned_long,_std::allocator<unsigned_long>_> asyncPositions;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> asyncs;
  size_t elementIndexSize;
  size_t varIndexLength;
  size_t localPosition;
  size_t startPosition;
  size_t position;
  vector<char,_std::allocator<char>_> *buffer;
  type lf_ReadElementIndex;
  Engine *in_stack_fffffffffffffe98;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  size_t *in_stack_fffffffffffffea8;
  allocator_type *in_stack_fffffffffffffeb0;
  allocator_type *__a;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *this_01;
  future<void> *local_108;
  __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
  local_100;
  unsigned_long *in_stack_ffffffffffffff08;
  type *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  launch in_stack_ffffffffffffff2c;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  byte bVar6;
  allocator_type in_stack_ffffffffffffff3f;
  type *in_stack_ffffffffffffff40;
  undefined1 local_a1 [25];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  vector<char,_std::allocator<char>_> *local_70;
  allocator local_51;
  string local_50 [32];
  vector<char,_std::allocator<char>_> *local_30;
  long local_28;
  
  local_28 = in_RSI + 0x40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50," BP3 variable index start < pg index start, in call to Open",&local_51);
  pvVar4 = (vector<char,_std::allocator<char>_> *)
           helper::GetDistance(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pvVar4;
  helper::ReadValue<unsigned_int>
            (in_stack_fffffffffffffea0,(size_t *)in_stack_fffffffffffffe98,false);
  helper::ReadValue<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8,SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
  local_70 = local_30;
  local_78 = 0;
  local_80 = (in_RDI[7] - in_RDI[6]) - 0xc;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x230) == 1) {
    while (local_78 < local_80) {
      std::
      tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>
      ::type::operator()(in_stack_ffffffffffffff40,
                         (Engine *)
                         CONCAT17(in_stack_ffffffffffffff3f,
                                  CONCAT16(in_stack_ffffffffffffff3e,
                                           CONCAT24(in_stack_ffffffffffffff3c,
                                                    in_stack_ffffffffffffff38))),
                         in_stack_ffffffffffffff30,
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      uVar2 = helper::ReadValue<unsigned_int>
                        (in_stack_fffffffffffffea0,(size_t *)in_stack_fffffffffffffe98,false);
      local_88 = (ulong)uVar2;
      local_30 = (vector<char,_std::allocator<char>_> *)
                 ((long)&(local_30->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
                 local_88);
      local_78 = (long)local_30 - (long)local_70;
    }
  }
  else {
    __n = (ulong)*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x230);
    this_01 = (vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_a1;
    std::allocator<std::future<void>_>::allocator((allocator<std::future<void>_> *)0xb74270);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              (this_01,__n,in_stack_fffffffffffffeb0);
    std::allocator<std::future<void>_>::~allocator((allocator<std::future<void>_> *)0xb74296);
    __fut = (future<void> *)(ulong)*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x230);
    __a = (allocator_type *)&stack0xffffffffffffff3f;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb742c0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,__n,__a);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb742e6);
    bVar6 = 0;
    while (local_78 < local_80) {
      for (uVar2 = 0; uVar2 < *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x230);
          uVar2 = uVar2 + 1) {
        in_stack_fffffffffffffea0 = local_30;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &stack0xffffffffffffff40,(ulong)uVar2);
        *pvVar5 = (value_type)in_stack_fffffffffffffea0;
        uVar3 = helper::ReadValue<unsigned_int>
                          (in_stack_fffffffffffffea0,(size_t *)in_stack_fffffffffffffe98,false);
        local_30 = (vector<char,_std::allocator<char>_> *)
                   ((long)&(local_30->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
                   (ulong)uVar3);
        local_78 = (long)local_30 - (long)local_70;
        if ((bVar6 & 1) != 0) {
          std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::operator[]
                    ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                     (local_a1 + 1),(ulong)uVar2);
          std::future<void>::get((future<void> *)__a);
        }
        if (local_78 <= local_80) {
          __args = std::ref<adios2::core::Engine>(in_stack_fffffffffffffe98);
          __args_1 = std::ref<std::vector<char,std::allocator<char>>const>
                               ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe98);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &stack0xffffffffffffff40,(ulong)uVar2);
          std::
          async<adios2::format::BP3Deserializer::ParseVariablesIndex(adios2::format::BufferSTL_const&,adios2::core::Engine&)::__0&,std::reference_wrapper<adios2::core::Engine>,std::reference_wrapper<std::vector<char,std::allocator<char>>const>,unsigned_long&>
                    (in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
                     (reference_wrapper<adios2::core::Engine> *)__args._M_data,
                     (reference_wrapper<const_std::vector<char,_std::allocator<char>_>_> *)
                     __args_1._M_data,in_stack_ffffffffffffff08);
          std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::operator[]
                    ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                     (local_a1 + 1),(ulong)uVar2);
          std::future<void>::operator=((future<void> *)__a,__fut);
          std::future<void>::~future((future<void> *)0xb7450d);
        }
      }
      bVar6 = 1;
    }
    local_100._M_current =
         (future<void> *)
         std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::begin
                   ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                    in_stack_fffffffffffffe98);
    local_108 = (future<void> *)
                std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::end
                          ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                           in_stack_fffffffffffffe98);
    while( true ) {
      __stat_loc = &local_108;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      this_00 = &__gnu_cxx::
                 __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                 ::operator*(&local_100)->super___basic_future<void>;
      bVar1 = std::__basic_future<void>::valid((__basic_future<void> *)0xb7458b);
      if (bVar1) {
        std::__basic_future<void>::wait(this_00,__stat_loc);
      }
      __gnu_cxx::
      __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
      ::operator++(&local_100);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)__a);
  }
  return;
}

Assistant:

void BP3Deserializer::ParseVariablesIndex(const BufferSTL &bufferSTL, core::Engine &engine)
{
    auto lf_ReadElementIndex = [&](core::Engine &engine, const std::vector<char> &buffer,
                                   size_t position) {
        const ElementIndexHeader header =
            ReadElementIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);

        switch (header.DataType)
        {

#define make_case(T)                                                                               \
    case (TypeTraits<T>::type_enum): {                                                             \
        DefineVariableInEngineIO<T>(header, engine, buffer, position);                             \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(make_case)
#undef make_case

        } // end switch
    };

    const auto &buffer = bufferSTL.m_Buffer;
    size_t position =
        helper::GetDistance(m_Minifooter.VarsIndexStart, m_Minifooter.PGIndexStart,
                            " BP3 variable index start < pg index start, in call to Open");

    helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian);
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    const size_t startPosition = position;
    size_t localPosition = 0;

    /* Note: In ADIOS 1.x BP3 files, length is unreliable and is
     * probably smaller than the actual length of the variable index. Let's use
     * here the more reliable limit: the start of attribute index - start of
     * variable index (- the already parsed 12 bytes)
     */
    const size_t varIndexLength =
        m_Minifooter.AttributesIndexStart - m_Minifooter.VarsIndexStart - 12;

    if (m_Parameters.Threads == 1)
    {
        while (localPosition < varIndexLength)
        {
            lf_ReadElementIndex(engine, buffer, position);

            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;
        }
        return;
    }

    // threads for reading Variables
    std::vector<std::future<void>> asyncs(m_Parameters.Threads);
    std::vector<size_t> asyncPositions(m_Parameters.Threads);

    bool launched = false;

    while (localPosition < varIndexLength)
    {
        // extract async positions
        for (unsigned int t = 0; t < m_Parameters.Threads; ++t)
        {
            asyncPositions[t] = position;
            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;

            if (launched)
            {
                asyncs[t].get();
            }

            if (localPosition <= varIndexLength)
            {
                asyncs[t] = std::async(std::launch::async, lf_ReadElementIndex, std::ref(engine),
                                       std::ref(buffer), asyncPositions[t]);
            }
        }
        launched = true;
    }

    for (auto &async : asyncs)
    {
        if (async.valid())
        {
            async.wait();
        }
    }
}